

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.h
# Opt level: O0

void __thiscall
tvm::runtime::GraphRuntime::Node::LoadAttrs(Node *this,JSONReader *reader,TVMOpParam *param)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ostringstream *poVar4;
  ostream *poVar5;
  LogMessageFatal local_208;
  LogCheckError local_80;
  LogCheckError _check_err;
  undefined1 local_68 [8];
  string value;
  string key;
  int bitmask;
  TVMOpParam *param_local;
  JSONReader *reader_local;
  Node *this_local;
  
  key.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  dmlc::JSONReader::BeginObject(reader);
  while (bVar1 = dmlc::JSONReader::NextObjectItem(reader,(string *)((long)&value.field_2 + 8)),
        bVar1) {
    dmlc::JSONReader::Read<std::__cxx11::string>
              (reader,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68)
    ;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&value.field_2 + 8),"func_name");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)param,(string *)local_68);
      key.field_2._12_4_ = key.field_2._12_4_ | 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&value.field_2 + 8),"num_inputs");
      if (bVar1) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        uVar3 = strtoul(pcVar2,(char **)0x0,10);
        param->num_inputs = (uint32_t)uVar3;
        key.field_2._12_4_ = key.field_2._12_4_ | 2;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&value.field_2 + 8),"num_outputs");
        if (bVar1) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          uVar3 = strtoul(pcVar2,(char **)0x0,10);
          param->num_outputs = (uint32_t)uVar3;
          key.field_2._12_4_ = key.field_2._12_4_ | 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&value.field_2 + 8),"flatten_data");
          if (bVar1) {
            pcVar2 = (char *)std::__cxx11::string::c_str();
            uVar3 = strtoul(pcVar2,(char **)0x0,10);
            param->flatten_data = (uint32_t)uVar3;
            key.field_2._12_4_ = key.field_2._12_4_ | 8;
          }
        }
      }
    }
  }
  dmlc::LogCheck_EQ((dmlc *)&local_80,key.field_2._12_4_,0xf);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_80);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/graph/graph_runtime.h"
               ,0xf4);
    poVar4 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_208);
    poVar5 = std::operator<<((ostream *)poVar4,"Check failed: ");
    poVar5 = std::operator<<(poVar5,"bitmask == 1|2|4|8");
    poVar5 = std::operator<<(poVar5,(string *)local_80.str);
    poVar5 = std::operator<<(poVar5,": ");
    std::operator<<(poVar5,"invalid format");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_208);
  }
  dmlc::LogCheckError::~LogCheckError(&local_80);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return;
}

Assistant:

void LoadAttrs(dmlc::JSONReader *reader, TVMOpParam* param) {
      int bitmask = 0;
      std::string key, value;
      reader->BeginObject();
      while (reader->NextObjectItem(&key)) {
        reader->Read(&value);
        if (key == "func_name") {
          param->func_name = value;
          bitmask |= 1;
        } else if (key == "num_inputs") {
          param->num_inputs = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 2;
        } else if (key == "num_outputs") {
          param->num_outputs = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 4;
        } else if (key == "flatten_data") {
          param->flatten_data = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 8;
        }
      }
      CHECK_EQ(bitmask, 1|2|4|8) << "invalid format";
    }